

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall
CRegexSearcherSimple::compile_and_search_back
          (CRegexSearcherSimple *this,char *patstr,size_t patlen,char *entirestr,char *searchstr,
          size_t searchlen,int *result_len)

{
  re_status_t rVar1;
  int iVar2;
  int iVar3;
  re_compiled_pattern_base pat;
  
  this->group_cnt_ = 0;
  clear_group_regs(this);
  rVar1 = CRegexParser::compile(this->parser_,patstr,patlen,&pat);
  if (rVar1 == RE_STATUS_SUCCESS) {
    this->group_cnt_ = pat.group_cnt;
    iVar2 = CRegexSearcher::search_back
                      (&this->super_CRegexSearcher,entirestr,searchstr,searchlen,&pat,
                       this->parser_->tuple_arr_,&pat.machine,
                       (re_group_register *)&(this->super_CRegexSearcher).field_0x24,result_len);
    if (-1 < iVar2) {
      iVar3 = (int)searchstr - ((int)entirestr + iVar2);
      (this->match_).start_ofs = iVar3;
      (this->match_).end_ofs = iVar3 + *result_len;
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int CRegexSearcherSimple::compile_and_search_back(
    const char *patstr, size_t patlen,
    const char *entirestr, const char *searchstr, size_t searchlen,
    int *result_len)
{
    /* no groups yet */
    group_cnt_ = 0;

    /* clear the group registers */
    clear_group_regs();

    /* compile the expression - return failure if we get an error */
    re_compiled_pattern_base pat;
    if (parser_->compile(patstr, patlen, &pat) != RE_STATUS_SUCCESS)
        return -1;

    /* remember the group count from the compiled pattern */
    group_cnt_ = pat.group_cnt;

    /* 
     *   search for the pattern in our copy of the string - use the copy so
     *   that the group registers stay valid even if the caller deallocates
     *   the original string after we return 
     */
    int m = search_back(entirestr, searchstr, searchlen,
                        &pat, parser_->tuple_arr_, &pat.machine,
                        regs_, result_len);

    /* save the match information on success */
    if (m >= 0)
    {
        match_.start_ofs = searchstr - entirestr - m;
        match_.end_ofs = match_.start_ofs + *result_len;
    }

    /* return the result */
    return m;
}